

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vmsumshs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  int aiStack_38 [4];
  int32_t prod [8];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined2 uVar16;
  
  lVar7 = 0;
  do {
    uVar1 = *(ulong *)((long)a + lVar7 * 2);
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = (short)(uVar1 >> 0x30);
    auVar3._8_2_ = (short)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._10_4_ = auVar2._10_4_;
    auVar5._6_8_ = 0;
    auVar5._0_6_ = auVar3._8_6_;
    auVar4._4_2_ = (short)(uVar1 >> 0x10);
    auVar4._0_4_ = (uint)uVar1;
    auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
    auVar15._0_4_ = (uint)uVar1 & 0xffff;
    auVar15._4_10_ = auVar4._4_10_;
    auVar15._14_2_ = 0;
    uVar1 = *(ulong *)((long)b + lVar7 * 2);
    uVar16 = (undefined2)(uVar1 >> 0x30);
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14._12_2_ = uVar16;
    auVar14._14_2_ = uVar16;
    uVar16 = (undefined2)(uVar1 >> 0x20);
    auVar13._12_4_ = auVar14._12_4_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13._10_2_ = uVar16;
    auVar12._10_6_ = auVar13._10_6_;
    auVar12._8_2_ = uVar16;
    auVar12._0_8_ = uVar1;
    uVar16 = (undefined2)(uVar1 >> 0x10);
    auVar11._8_8_ = auVar12._8_8_;
    auVar11._6_2_ = uVar16;
    auVar11._4_2_ = uVar16;
    auVar11._0_2_ = (undefined2)uVar1;
    auVar11._2_2_ = auVar11._0_2_;
    auVar15 = pmaddwd(auVar11,auVar15);
    *(undefined1 (*) [16])(aiStack_38 + lVar7) = auVar15;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 8);
  bVar6 = false;
  lVar7 = 3;
  do {
    lVar9 = (long)aiStack_38[lVar7 * 2 + 1] + (long)aiStack_38[lVar7 * 2] + (long)c->s32[lVar7];
    lVar8 = 0x7fffffff;
    if (lVar9 < 0x7fffffff) {
      lVar8 = lVar9;
    }
    if ((int)lVar9 != lVar9) {
      bVar6 = true;
    }
    if (lVar8 < -0x7fffffff) {
      lVar8 = -0x80000000;
    }
    r->u32[lVar7] = (uint32_t)lVar8;
    bVar10 = lVar7 != 0;
    lVar7 = lVar7 + -1;
  } while (bVar10);
  if (bVar6) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

void helper_vmsumshs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->s16); i++) {
        prod[i] = (int32_t)a->s16[i] * b->s16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        int64_t t = (int64_t)c->s32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtsdsw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}